

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O3

void __thiscall pstore::file::system_error::~system_error(system_error *this)

{
  ~system_error(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

system_error::~system_error () noexcept = default;